

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestCaseGroup *this_00;
  InvalidDrawCase *pIVar1;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"drawarrays",
             "draw arrays");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"drawelements"
             ,"draw elements");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"random","random draw commands.");
  (this_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e5ae78;
  tcu::TestNode::addChild(node,(TestNode *)this_00);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_count",
             "Draw arrays vertex elements beyond the array end are accessed",DRAW_ARRAYS,
             INVALID_DATA_COUNT);
  tcu::TestNode::addChild(node_00,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_first",
             "Draw arrays vertex elements beyond the array end are accessed",DRAW_ARRAYS,
             INVALID_DATA_FIRST);
  tcu::TestNode::addChild(node_00,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_primcount",
             "Draw arrays vertex elements beyond the array end are accessed",DRAW_ARRAYS,
             INVALID_DATA_INSTANCED);
  tcu::TestNode::addChild(node_00,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"reserved_non_zero",
             "reservedMustBeZero is set to non-zero value",DRAW_ARRAYS,INVALID_RESERVED);
  tcu::TestNode::addChild(node_00,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_count",
             "Draw elements vertex elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_DATA_COUNT);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_basevertex",
             "Draw elements vertex elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_DATA_FIRST);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_indices",
             "Draw elements vertex elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_INDEX);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"data_over_bounds_with_primcount",
             "Draw elements vertex elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_DATA_INSTANCED);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"index_over_bounds_with_count",
             "Draw elements index elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_INDEX_COUNT);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"index_over_bounds_with_firstindex",
             "Draw elements index elements beyond the array end are accessed",DRAW_ELEMENTS,
             INVALID_INDEX_FIRST);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  pIVar1 = (InvalidDrawCase *)operator_new(0x98);
  Stress::anon_unknown_0::InvalidDrawCase::InvalidDrawCase
            (pIVar1,(this->super_TestCaseGroup).m_context,"reserved_non_zero",
             "reservedMustBeZero is set to non-zero value",DRAW_ELEMENTS,INVALID_RESERVED);
  tcu::TestNode::addChild(node_01,(TestNode *)pIVar1);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");
	tcu::TestCaseGroup* const drawArraysGroup	= new tcu::TestCaseGroup(m_testCtx, "drawarrays", "draw arrays");
	tcu::TestCaseGroup* const drawElementsGroup	= new tcu::TestCaseGroup(m_testCtx, "drawelements", "draw elements");

	addChild(unalignedGroup);
	addChild(drawArraysGroup);
	addChild(drawElementsGroup);

	// .unaligned_data
	{
		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

	// .drawarrays
	{
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_count",			"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_COUNT));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_first",			"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_FIRST));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_primcount",		"Draw arrays vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_DATA_INSTANCED));
		drawArraysGroup->addChild(new InvalidDrawCase(m_context, "reserved_non_zero",					"reservedMustBeZero is set to non-zero value",						InvalidDrawCase::DRAW_ARRAYS,	InvalidDrawCase::INVALID_RESERVED));
	}

	// .drawelements
	{
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_count",		"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS, InvalidDrawCase::INVALID_DATA_COUNT));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_basevertex",	"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_DATA_FIRST));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_indices",		"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "data_over_bounds_with_primcount",	"Draw elements vertex elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_DATA_INSTANCED));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "index_over_bounds_with_count",		"Draw elements index elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX_COUNT));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "index_over_bounds_with_firstindex",	"Draw elements index elements beyond the array end are accessed",	InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_INDEX_FIRST));
		drawElementsGroup->addChild(new InvalidDrawCase(m_context, "reserved_non_zero",					"reservedMustBeZero is set to non-zero value",						InvalidDrawCase::DRAW_ELEMENTS,	InvalidDrawCase::INVALID_RESERVED));
	}
}